

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool cmIfCommand(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
                cmExecutionStatus *inStatus)

{
  cmMakefile *this;
  bool bVar1;
  cmFunctionBlocker *pcVar2;
  pointer *__ptr;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  MessageType status;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmConditionEvaluator conditionEvaluator;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> local_128;
  MessageType local_11c;
  string local_118;
  cmListFileBacktrace local_f8;
  string local_e8;
  string local_c8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_a8;
  cmConditionEvaluator local_90;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  pointer local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this = inStatus->Makefile;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_a8.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  cmMakefile::ExpandArguments(this,args,&local_a8);
  cmMakefile::GetBacktrace(this);
  cmConditionEvaluator::cmConditionEvaluator(&local_90,this,&local_f8);
  if (local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  bVar1 = cmConditionEvaluator::IsTrue(&local_90,&local_a8,&local_118,&local_11c);
  if (local_118._M_string_length != 0) {
    cmIfCommandError_abi_cxx11_(&local_e8,&local_a8);
    local_60._M_len = 3;
    local_60._M_str = "if ";
    local_50 = local_e8._M_string_length;
    local_48 = local_e8._M_dataplus._M_p;
    local_40 = local_118._M_string_length;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_60;
    cmCatViews_abi_cxx11_(&local_c8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_11c == FATAL_ERROR) {
      cmMakefile::IssueMessage(this,FATAL_ERROR,&local_c8);
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else {
      cmMakefile::IssueMessage(this,local_11c,&local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_11c == FATAL_ERROR) goto LAB_0030d506;
  }
  pcVar2 = (cmFunctionBlocker *)operator_new(0xb8);
  memset(&(pcVar2->StartingContext).Name._M_string_length,0,0xa8);
  (pcVar2->StartingContext).Name._M_dataplus._M_p = (pointer)&(pcVar2->StartingContext).Name.field_2
  ;
  (pcVar2->StartingContext).FilePath._M_dataplus._M_p =
       (pointer)&(pcVar2->StartingContext).FilePath.field_2;
  (pcVar2->StartingContext).DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (pcVar2->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar2->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar2->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2->ScopeDepth = 1;
  pcVar2->_vptr_cmFunctionBlocker = (_func_int **)&PTR__cmIfFunctionBlocker_008b8018;
  pcVar2[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
  pcVar2[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
  pcVar2[1].StartingContext.Name._M_string_length = 0;
  pcVar2[1].StartingContext.Name.field_2._M_local_buf[0] = !bVar1;
  if (bVar1) {
    pcVar2[1].StartingContext.Name.field_2._M_local_buf[1] = '\x01';
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)(pcVar2 + 1),args);
  local_128._M_head_impl = pcVar2;
  cmMakefile::AddFunctionBlocker
            (this,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                  &local_128);
  if (local_128._M_head_impl != (cmFunctionBlocker *)0x0) {
    (*(local_128._M_head_impl)->_vptr_cmFunctionBlocker[1])();
  }
  local_128._M_head_impl = (cmFunctionBlocker *)0x0;
LAB_0030d506:
  if (local_90.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

bool cmIfCommand(std::vector<cmListFileArgument> const& args,
                 cmExecutionStatus& inStatus)
{
  cmMakefile& makefile = inStatus.GetMakefile();
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  makefile.ExpandArguments(args, expandedArguments);

  MessageType status;

  cmConditionEvaluator conditionEvaluator(makefile, makefile.GetBacktrace());

  bool isTrue =
    conditionEvaluator.IsTrue(expandedArguments, errorString, status);

  if (!errorString.empty()) {
    std::string err =
      cmStrCat("if ", cmIfCommandError(expandedArguments), errorString);
    if (status == MessageType::FATAL_ERROR) {
      makefile.IssueMessage(MessageType::FATAL_ERROR, err);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    makefile.IssueMessage(status, err);
  }

  {
    auto fb = cm::make_unique<cmIfFunctionBlocker>();
    // if is isn't true block the commands
    fb->IsBlocking = !isTrue;
    if (isTrue) {
      fb->HasRun = true;
    }
    fb->Args = args;
    makefile.AddFunctionBlocker(std::move(fb));
  }

  return true;
}